

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_int_scan.cpp
# Opt level: O1

void Omega_h::fill_right(Write<int> *a)

{
  Alloc *pAVar1;
  int *piVar2;
  long *plVar3;
  undefined8 *puVar4;
  int iVar5;
  ulong *puVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  ScopedTimer omega_h_scoped_function_timer;
  string __str;
  ScopedTimer local_a1;
  long *local_a0;
  undefined8 local_98;
  long local_90;
  undefined8 uStack_88;
  ulong *local_80;
  long local_78;
  ulong local_70 [2];
  ulong *local_60;
  long local_58;
  ulong local_50;
  long lStack_48;
  long *local_40 [2];
  long local_30 [2];
  
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_40,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_int_scan.cpp"
             ,"");
  plVar3 = (long *)std::__cxx11::string::append((char *)local_40);
  puVar6 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar6) {
    local_50 = *puVar6;
    lStack_48 = plVar3[3];
    local_60 = &local_50;
  }
  else {
    local_50 = *puVar6;
    local_60 = (ulong *)*plVar3;
  }
  local_58 = plVar3[1];
  *plVar3 = (long)puVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  local_80 = local_70;
  std::__cxx11::string::_M_construct((ulong)&local_80,'\x02');
  *(undefined2 *)local_80 = 0x3632;
  uVar7 = 0xf;
  if (local_60 != &local_50) {
    uVar7 = local_50;
  }
  if (uVar7 < (ulong)(local_78 + local_58)) {
    uVar7 = 0xf;
    if (local_80 != local_70) {
      uVar7 = local_70[0];
    }
    if ((ulong)(local_78 + local_58) <= uVar7) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_80,0,(char *)0x0,(ulong)local_60);
      goto LAB_002f1b5a;
    }
  }
  puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_60,(ulong)local_80);
LAB_002f1b5a:
  local_a0 = &local_90;
  plVar3 = puVar4 + 2;
  if ((long *)*puVar4 == plVar3) {
    local_90 = *plVar3;
    uStack_88 = puVar4[3];
  }
  else {
    local_90 = *plVar3;
    local_a0 = (long *)*puVar4;
  }
  local_98 = puVar4[1];
  *puVar4 = plVar3;
  puVar4[1] = 0;
  *(undefined1 *)plVar3 = 0;
  begin_code("fill_right",(char *)local_a0);
  if (local_a0 != &local_90) {
    operator_delete(local_a0,local_90 + 1);
  }
  if (local_80 != local_70) {
    operator_delete(local_80,local_70[0] + 1);
  }
  if (local_60 != &local_50) {
    operator_delete(local_60,local_50 + 1);
  }
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  pAVar1 = (a->shared_alloc_).alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    uVar7 = pAVar1->size;
  }
  else {
    uVar7 = (ulong)pAVar1 >> 3;
  }
  lVar9 = (long)(int)(uVar7 >> 2);
  if (0 < lVar9) {
    piVar2 = (int *)(a->shared_alloc_).direct_ptr;
    entering_parallel = 0;
    if ((uVar7 & 0x3fffffffc) != 4) {
      iVar5 = *piVar2;
      lVar8 = 2;
      if (2 < lVar9) {
        lVar8 = lVar9;
      }
      lVar9 = 1;
      do {
        if (iVar5 <= piVar2[lVar9]) {
          iVar5 = piVar2[lVar9];
        }
        piVar2[lVar9] = iVar5;
        lVar9 = lVar9 + 1;
      } while (lVar8 != lVar9);
    }
  }
  ScopedTimer::~ScopedTimer(&local_a1);
  return;
}

Assistant:

void fill_right(Write<LO> a) {
  OMEGA_H_TIME_FUNCTION;
  auto const first = a.begin();
  auto const last = a.end();
  auto const result = a.begin();
  auto const op = maximum<LO>();
  auto transform = identity<LO>();
  transform_inclusive_scan(first, last, result, op, std::move(transform));
}